

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void compact_float32_suite::test_array32_float32_one(void)

{
  view_type *pvVar1;
  const_iterator pvVar2;
  const_iterator pvVar3;
  undefined4 local_74;
  value local_70 [2];
  undefined4 local_68;
  undefined4 local_64;
  value_type expected [4];
  undefined4 local_58;
  value local_54 [2];
  undefined4 local_4c;
  value local_48 [2];
  undefined1 local_40 [8];
  decoder decoder;
  value_type input [9];
  
  stack0xffffffffffffffef = 0x80000000000004cd;
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[9]>
            ((decoder *)local_40,(uchar (*) [9])((long)&decoder.current.view._M_str + 7));
  local_48[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_40);
  local_4c = 0xcd;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::array32_float32",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xdb8,"void compact_float32_suite::test_array32_float32_one()",local_48,&local_4c);
  local_54[0] = trial::protocol::bintoken::detail::decoder::symbol((decoder *)local_40);
  local_58 = 7;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::symbol::value,trial::protocol::bintoken::token::symbol::value>
            ("decoder.symbol()","token::symbol::array",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xdb9,"void compact_float32_suite::test_array32_float32_one()",local_54,&local_58);
  expected = (value_type  [4])
             trial::protocol::bintoken::detail::decoder::category((decoder *)local_40);
  local_64 = 2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::category::value,trial::protocol::bintoken::token::category::value>
            ("decoder.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xdba,"void compact_float32_suite::test_array32_float32_one()",expected,&local_64);
  local_68 = 0x3f800000;
  pvVar1 = trial::protocol::bintoken::detail::decoder::literal((decoder *)local_40);
  pvVar2 = std::
           basic_string_view<unsigned_char,_trial::protocol::core::detail::char_traits<unsigned_char>_>
           ::begin(pvVar1);
  pvVar1 = trial::protocol::bintoken::detail::decoder::literal((decoder *)local_40);
  pvVar3 = std::
           basic_string_view<unsigned_char,_trial::protocol::core::detail::char_traits<unsigned_char>_>
           ::end(pvVar1);
  boost::detail::
  test_all_with_impl<std::ostream,unsigned_char_const*,unsigned_char_const*,std::equal_to<unsigned_char>>
            (&std::cerr,
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xdc0,"void compact_float32_suite::test_array32_float32_one()",pvVar2,pvVar3,&local_68
             ,&local_64);
  trial::protocol::bintoken::detail::decoder::next((decoder *)local_40);
  local_70[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_40);
  local_74 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0xdc2,"void compact_float32_suite::test_array32_float32_one()",local_70,&local_74);
  return;
}

Assistant:

void test_array32_float32_one()
{
    const value_type input[] = { token::code::array32_float32, 0x04, 0x00, 0x00, 0x00, 0x00, 0x00, 0x80, 0x3F };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::array32_float32);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.symbol(), token::symbol::array);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.category(), token::category::data);
    const value_type expected[] = {
        0x00, 0x00, 0x80, 0x3F
    };
    TRIAL_PROTOCOL_TEST_ALL_WITH(decoder.literal().begin(), decoder.literal().end(),
                                 expected, expected + sizeof(expected),
                                 std::equal_to<value_type>());
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}